

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

Var Js::JavascriptObject::EntryHasOwn(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  PropertyId propertyId;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptLibrary *pJVar7;
  PropertyRecord *local_88;
  PropertyString *local_70;
  PropertyString *propertyString;
  PropertyRecord *propertyRecord;
  Var propertyName;
  RecyclableObject *dynamicObject;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x66,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  dynamicObject = (RecyclableObject *)RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x69,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  propertyName = (Var)0x0;
  if (1 < ((uint)scriptContext & 0xffffff)) {
    pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
    BVar3 = JavascriptConversion::ToObject
                      (pvVar6,(ScriptContext *)dynamicObject,(RecyclableObject **)&propertyName);
    if (BVar3 != 0) {
      if (((uint)scriptContext & 0xffffff) == 2) {
        pJVar7 = ScriptContext::GetLibrary((ScriptContext *)dynamicObject);
        local_88 = (PropertyRecord *)
                   JavascriptLibraryBase::GetUndefined(&pJVar7->super_JavascriptLibraryBase);
      }
      else {
        local_88 = (PropertyRecord *)Arguments::operator[]((Arguments *)&scriptContext,2);
      }
      propertyRecord = local_88;
      JavascriptConversion::ToPropertyKey
                (local_88,(ScriptContext *)dynamicObject,(PropertyRecord **)&propertyString,
                 &local_70);
      pvVar6 = propertyName;
      propertyId = PropertyRecord::GetPropertyId((PropertyRecord *)propertyString);
      BVar3 = Js::JavascriptOperators::HasOwnProperty
                        (pvVar6,propertyId,(ScriptContext *)dynamicObject,local_70);
      if (BVar3 == 0) {
        pJVar7 = ScriptContext::GetLibrary((ScriptContext *)dynamicObject);
        callInfo_local =
             (CallInfo)JavascriptLibraryBase::GetFalse(&pJVar7->super_JavascriptLibraryBase);
      }
      else {
        pJVar7 = ScriptContext::GetLibrary((ScriptContext *)dynamicObject);
        callInfo_local =
             (CallInfo)JavascriptLibraryBase::GetTrue(&pJVar7->super_JavascriptLibraryBase);
      }
      return (Var)callInfo_local;
    }
  }
  JavascriptError::ThrowTypeError((ScriptContext *)dynamicObject,-0x7ff5ec36,L"Object.hasOwn");
}

Assistant:

Var JavascriptObject::EntryHasOwn(RecyclableObject* function, CallInfo callInfo, ...)
{
    JIT_HELPER_REENTRANT_HEADER(Object_HasOwn);
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    RecyclableObject* dynamicObject = nullptr;
    // first parameter must exist and be an object coercible or throw type error
    if (args.Info.Count < 2 || FALSE == JavascriptConversion::ToObject(args[1], scriptContext, &dynamicObject))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("Object.hasOwn"));
    }

    // if there is only one parameter use undefined as the property to query
    Var propertyName = args.Info.Count == 2 ? scriptContext->GetLibrary()->GetUndefined() : args[2];

    const PropertyRecord* propertyRecord;
    PropertyString* propertyString;
    JavascriptConversion::ToPropertyKey(propertyName, scriptContext, &propertyRecord, &propertyString);

    if (JavascriptOperators::HasOwnProperty(dynamicObject, propertyRecord->GetPropertyId(), scriptContext, propertyString))
    {
        return scriptContext->GetLibrary()->GetTrue();
    }

    return scriptContext->GetLibrary()->GetFalse();
    JIT_HELPER_END(Object_HasOwn);
}